

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission_parse.cpp
# Opt level: O2

FName __thiscall FMapInfoParser::CheckEndSequence(FMapInfoParser *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  FString *this_00;
  FIntermissionDescriptor *desc;
  FIntermissionAction *this_01;
  FMapInfoParser *in_RSI;
  char *pcVar4;
  FString seqname;
  FName local_2c;
  FIntermissionAction *action;
  
  bVar2 = FScanner::Compare(&in_RSI->sc,"endgame");
  if (bVar2) {
    bVar2 = FScanner::CheckString(&in_RSI->sc,"{");
    if (bVar2) {
      ParseEndGame(this);
      goto LAB_003295bd;
    }
    FScanner::UnGet(&in_RSI->sc);
LAB_003294d3:
    pcVar4 = "Inter_Pic3";
  }
  else {
    pcVar4 = (in_RSI->sc).String;
    iVar3 = strncasecmp(pcVar4,"EndGame",7);
    if (iVar3 == 0) {
      cVar1 = pcVar4[7];
      if (cVar1 == '1') {
        pcVar4 = "Inter_Pic1";
      }
      else if (cVar1 == 'W') {
LAB_003295ae:
        pcVar4 = "Inter_Underwater";
      }
      else {
        if (cVar1 == '3') goto LAB_00329529;
        if (cVar1 == 'C') goto LAB_00329548;
        if (cVar1 == 'S') {
          pcVar4 = "Inter_Strife";
        }
        else {
          if (cVar1 != '2') goto LAB_003294d3;
          pcVar4 = "Inter_Pic2";
        }
      }
    }
    else {
      bVar2 = FScanner::Compare(&in_RSI->sc,"endpic");
      if (bVar2) {
        ParseComma(in_RSI);
        FScanner::MustGetString(&in_RSI->sc);
        seqname.Chars = FString::NullString.Nothing;
        FString::NullString.RefCount = FString::NullString.RefCount + 1;
        this_00 = FString::operator+=(&seqname,"@EndPic_");
        FString::operator+=(this_00,(in_RSI->sc).String);
        desc = (FIntermissionDescriptor *)operator_new(0x18);
        (desc->mLink).Index = 0;
        (desc->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.Array =
             (FIntermissionAction **)0x0;
        (desc->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.Most = 0;
        (desc->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.Count = 0;
        this_01 = (FIntermissionAction *)operator_new(0x60);
        FIntermissionAction::FIntermissionAction(this_01);
        action = this_01;
        FString::operator=(&this_01->mBackground,(in_RSI->sc).String);
        TArray<FIntermissionAction_*,_FIntermissionAction_*>::Push
                  (&(desc->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>,
                   &action);
        FName::FName(&local_2c,&seqname);
        ReplaceIntermission(&local_2c,desc);
        FName::FName((FName *)this,&seqname);
        FString::~FString(&seqname);
        goto LAB_003295bd;
      }
      bVar2 = FScanner::Compare(&in_RSI->sc,"endbunny");
      if (bVar2) {
LAB_00329529:
        pcVar4 = "Inter_Bunny";
      }
      else {
        bVar2 = FScanner::Compare(&in_RSI->sc,"endcast");
        if (bVar2) {
LAB_00329548:
          pcVar4 = "Inter_Cast";
        }
        else {
          bVar2 = FScanner::Compare(&in_RSI->sc,"enddemon");
          if (bVar2) {
            pcVar4 = "Inter_Demonscroll";
          }
          else {
            bVar2 = FScanner::Compare(&in_RSI->sc,"endchess");
            if (bVar2) {
              pcVar4 = "Inter_Chess";
            }
            else {
              bVar2 = FScanner::Compare(&in_RSI->sc,"endunderwater");
              if (bVar2) goto LAB_003295ae;
              bVar2 = FScanner::Compare(&in_RSI->sc,"endbuystrife");
              if (bVar2) {
                pcVar4 = "Inter_BuyStrife";
              }
              else {
                bVar2 = FScanner::Compare(&in_RSI->sc,"endtitle");
                if (!bVar2) {
                  bVar2 = FScanner::Compare(&in_RSI->sc,"endsequence");
                  if (bVar2) {
                    ParseComma(in_RSI);
                    FScanner::MustGetString(&in_RSI->sc);
                    pcVar4 = (in_RSI->sc).String;
                    if (pcVar4 != (char *)0x0) goto LAB_003295b5;
                  }
                  *(undefined4 *)&(this->sc).String = 0;
                  goto LAB_003295bd;
                }
                pcVar4 = "Inter_Titlescreen";
              }
            }
          }
        }
      }
    }
  }
LAB_003295b5:
  FName::FName((FName *)this,pcVar4);
LAB_003295bd:
  return (FName)(int)this;
}

Assistant:

FName FMapInfoParser::CheckEndSequence()
{
	const char *seqname = NULL;

	if (sc.Compare("endgame"))
	{
		if (!sc.CheckString("{"))
		{
			// Make Demon Eclipse work again
			sc.UnGet();
			goto standard_endgame;
		}
		return ParseEndGame();
	}
	else if (strnicmp (sc.String, "EndGame", 7) == 0)
	{
		switch (sc.String[7])
		{
		case '1':	seqname = "Inter_Pic1";		break;
		case '2':	seqname = "Inter_Pic2";		break;
		case '3':	seqname = "Inter_Bunny";	break;
		case 'C':	seqname = "Inter_Cast";		break;
		case 'W':	seqname = "Inter_Underwater";	break;
		case 'S':	seqname = "Inter_Strife";	break;
	standard_endgame:
		default:	seqname = "Inter_Pic3";		break;
		}
	}
	else if (sc.Compare("endpic"))
	{
		ParseComma();
		sc.MustGetString ();
		FString seqname;
		seqname << "@EndPic_" << sc.String;
		FIntermissionDescriptor *desc = new FIntermissionDescriptor;
		FIntermissionAction *action = new FIntermissionAction;
		action->mBackground = sc.String;
		desc->mActions.Push(action);
		ReplaceIntermission(seqname, desc);
		return FName(seqname);
	}
	else if (sc.Compare("endbunny"))
	{
		seqname = "Inter_Bunny";
	}
	else if (sc.Compare("endcast"))
	{
		seqname = "Inter_Cast";
	}
	else if (sc.Compare("enddemon"))
	{
		seqname = "Inter_Demonscroll";
	}
	else if (sc.Compare("endchess"))
	{
		seqname = "Inter_Chess";
	}
	else if (sc.Compare("endunderwater"))
	{
		seqname = "Inter_Underwater";
	}
	else if (sc.Compare("endbuystrife"))
	{
		seqname = "Inter_BuyStrife";
	}
	else if (sc.Compare("endtitle"))
	{
		seqname = "Inter_Titlescreen";
	}
	else if (sc.Compare("endsequence"))
	{
		ParseComma();
		sc.MustGetString();
		seqname = sc.String;
	}

	if (seqname != NULL)
	{
		return FName(seqname);
	}
	return NAME_None;
}